

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall ft::list<int,_ft::allocator<int>_>::listInit(list<int,_ft::allocator<int>_> *this)

{
  listNode<int> *plVar1;
  node *pnVar2;
  listNode<int> local_30;
  
  pnVar2 = (node *)operator_new(0x18);
  this->m_head = pnVar2;
  pnVar2 = (node *)operator_new(0x18);
  this->m_tail = pnVar2;
  local_30.data = 0;
  local_30.prev = (listNode<int> *)0x0;
  local_30.next = (listNode<int> *)0x0;
  listNode<int>::listNode(this->m_head,&local_30);
  local_30.data = 0;
  local_30.prev = (listNode<int> *)0x0;
  local_30.next = (listNode<int> *)0x0;
  listNode<int>::listNode(this->m_tail,&local_30);
  pnVar2 = this->m_head;
  plVar1 = this->m_tail;
  pnVar2->next = plVar1;
  plVar1->prev = pnVar2;
  return;
}

Assistant:

void listInit() {
		this->m_head = this->m_alloc.allocate(1);
		this->m_tail = this->m_alloc.allocate(1);
		this->m_alloc.construct(this->m_head, node());
		this->m_alloc.construct(this->m_tail, node());
		this->head()->next = this->tail();
		this->tail()->prev = this->head();
	}